

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  long lVar1;
  int iVar2;
  int iVar3;
  xmlChar *str1;
  xmlNodePtr node_00;
  byte *str1_00;
  xmlHashTablePtr pxVar4;
  ulong uVar5;
  xmlAttrPtr attr;
  xmlSchemaTypePtr value;
  int *piVar6;
  int *piVar7;
  undefined4 uVar8;
  char *in_R8;
  long lVar9;
  int *piVar10;
  bool bVar11;
  xmlChar *in_stack_ffffffffffffffa8;
  xmlSchemaParserCtxtPtr pxVar12;
  int local_44;
  int *local_40;
  
  str1 = xmlSchemaGetProp(ctxt,(xmlNodePtr)wildc,"processContents");
  iVar3 = 0;
  uVar8 = 3;
  local_44 = 0;
  if ((str1 != (xmlChar *)0x0) &&
     (iVar2 = xmlStrEqual(str1,(xmlChar *)"strict"), local_44 = iVar3, iVar2 == 0)) {
    iVar3 = xmlStrEqual(str1,(xmlChar *)"skip");
    uVar8 = 1;
    if (iVar3 == 0) {
      iVar3 = xmlStrEqual(str1,(xmlChar *)"lax");
      uVar8 = 2;
      if (iVar3 == 0) {
        in_R8 = "(strict | skip | lax)";
        local_44 = 0xbdd;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)wildc,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(strict | skip | lax)",(char *)str1,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,(xmlChar *)ctxt);
        uVar8 = 3;
      }
    }
  }
  *(undefined4 *)&schema->annot = uVar8;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)wildc,"namespace");
  pxVar12 = ctxt;
  str1_00 = xmlSchemaGetNodeContent(ctxt,node_00);
  if (str1_00 != (byte *)0x0) {
    if ((node_00 == (xmlNodePtr)0x0) ||
       (iVar3 = xmlStrEqual(str1_00,(xmlChar *)"##any"), iVar3 != 0)) {
      *(undefined4 *)((long)&schema->annot + 4) = 1;
      return local_44;
    }
    iVar3 = xmlStrEqual(str1_00,(xmlChar *)"##other");
    if (iVar3 == 0) {
      piVar10 = &schema->flags;
      local_40 = (int *)0x0;
      do {
        while ((uVar5 = (ulong)*str1_00, uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)
               )) {
          str1_00 = str1_00 + 1;
        }
        lVar9 = 0;
        while ((0x20 < (byte)uVar5 || ((0x100002601U >> (uVar5 & 0x3f) & 1) == 0))) {
          lVar1 = lVar9 + 1;
          lVar9 = lVar9 + 1;
          uVar5 = (ulong)str1_00[lVar1];
        }
        if (lVar9 == 0) {
          return local_44;
        }
        attr = (xmlAttrPtr)xmlStrndup(str1_00,(int)lVar9);
        iVar3 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##other");
        if ((iVar3 == 0) && (iVar3 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##any"), iVar3 == 0)) {
          iVar3 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##targetNamespace");
          piVar6 = piVar10;
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##local");
            if (iVar3 == 0) {
              value = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
              xmlSchemaPValAttrNodeValue
                        (ctxt,(xmlSchemaBasicItemPtr)node_00,attr,(xmlChar *)value,
                         (xmlSchemaTypePtr)in_R8);
              pxVar4 = (xmlHashTablePtr)xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
              ctxt = pxVar12;
            }
            else {
              pxVar4 = (xmlHashTablePtr)0x0;
              ctxt = pxVar12;
            }
          }
          else {
            pxVar4 = (xmlHashTablePtr)ctxt->targetNamespace;
            ctxt = pxVar12;
          }
          do {
            piVar6 = *(int **)piVar6;
            if (piVar6 == (int *)0x0) {
              piVar6 = (int *)(*xmlMalloc)(0x10);
              if (piVar6 == (int *)0x0) {
                xmlSchemaPErrMemory(ctxt);
                (*xmlFree)(attr);
                return -1;
              }
              *(xmlHashTablePtr *)(piVar6 + 2) = pxVar4;
              *(undefined8 *)piVar6 = 0;
              piVar7 = piVar10;
              pxVar12 = ctxt;
              if ((*(long *)piVar10 == 0) ||
                 (bVar11 = local_40 != (int *)0x0, piVar7 = local_40, local_40 = piVar6, bVar11)) {
                *(int **)piVar7 = piVar6;
                local_40 = piVar6;
              }
              break;
            }
            pxVar12 = ctxt;
          } while (pxVar4 != *(xmlHashTablePtr *)(piVar6 + 2));
        }
        else {
          local_44 = 0x700;
          in_R8 = "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))";
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)node_00,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)
                     "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                     (char *)attr,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                     (xmlChar *)pxVar12);
        }
        str1_00 = str1_00 + lVar9;
        (*xmlFree)(attr);
        if (*str1_00 == 0) {
          return local_44;
        }
      } while( true );
    }
    pxVar4 = (xmlHashTablePtr)(*xmlMalloc)(0x10);
    if (pxVar4 != (xmlHashTablePtr)0x0) {
      pxVar4->table = (xmlHashEntry *)0x0;
      pxVar4->size = 0;
      pxVar4->nbElems = 0;
      schema->typeDecl = pxVar4;
      *(xmlChar **)&pxVar4->size = ctxt->targetNamespace;
      return local_44;
    }
    xmlSchemaPErrMemory(ctxt);
    schema->typeDecl = (xmlHashTablePtr)0x0;
  }
  return -1;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (ns == NULL)
        return (-1);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}